

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnSelect
          (SharedValidator *this,Location *loc,Index result_count,Type *result_types)

{
  Result RVar1;
  Result RVar2;
  TypeVector local_28;
  
  this->expr_loc_ = loc;
  if (result_count < 2) {
    local_28.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_28.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
              ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_28,result_types,
               result_types + result_count);
    RVar1 = TypeChecker::OnSelect(&this->typechecker_,&local_28);
    if (local_28.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    RVar1 = PrintError(this,loc,"invalid arity in select instruction: %u.",(ulong)result_count);
  }
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = RVar1.enum_ == Error;
  return (Result)RVar2.enum_;
}

Assistant:

Result SharedValidator::OnSelect(const Location& loc,
                                 Index result_count,
                                 Type* result_types) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  if (result_count > 1) {
    result |=
        PrintError(loc, "invalid arity in select instruction: %" PRIindex ".",
                   result_count);
  } else {
    result |= typechecker_.OnSelect(ToTypeVector(result_count, result_types));
  }
  return result;
}